

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

stbi_uc * stbi__gif_load_next(stbi__context *s,stbi__gif *g,int *comp,int req_comp,stbi_uc *two_back
                             )

{
  stbi_uc *psVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  byte bVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  stbi_uc *psVar14;
  stbi_uc *__s;
  stbi_uc *psVar15;
  byte *pbVar16;
  byte *pbVar17;
  byte *pbVar18;
  stbi_uc sVar19;
  uint uVar20;
  undefined4 in_register_0000000c;
  ulong uVar21;
  int iVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  char *pcVar26;
  uint n;
  size_t __size;
  uint uVar27;
  size_t __size_00;
  long in_FS_OFFSET;
  
  psVar1 = g->out;
  if (psVar1 == (stbi_uc *)0x0) {
    iVar8 = stbi__gif_header(s,g,comp,0);
    if (iVar8 == 0) {
      return (stbi_uc *)0x0;
    }
    iVar8 = g->w;
    iVar9 = g->h;
    iVar10 = stbi__mad3sizes_valid(4,iVar8,iVar9,0);
    if (iVar10 == 0) {
      pcVar26 = "too large";
      goto LAB_0011cfec;
    }
    iVar9 = iVar9 * iVar8;
    __size = (size_t)(iVar9 * 4);
    psVar14 = (stbi_uc *)malloc(__size);
    g->out = psVar14;
    __s = (stbi_uc *)malloc(__size);
    g->background = __s;
    __size_00 = (size_t)iVar9;
    psVar15 = (stbi_uc *)malloc(__size_00);
    g->history = psVar15;
    pcVar26 = "outofmem";
    if ((psVar14 == (stbi_uc *)0x0) || (psVar15 == (stbi_uc *)0x0 || __s == (stbi_uc *)0x0))
    goto LAB_0011cfec;
    memset(psVar14,0,__size);
    memset(__s,0,__size);
    memset(psVar15,0,__size_00);
  }
  else {
    uVar24 = (uint)g->eflags >> 2 & 7;
    uVar7 = g->h * g->w;
    uVar25 = 2;
    if (uVar24 != 3) {
      uVar25 = uVar24;
    }
    if (CONCAT44(in_register_0000000c,req_comp) != 0) {
      uVar25 = uVar24;
    }
    if (uVar25 == 3) {
      if (0 < (int)uVar7) {
        uVar21 = 0;
        do {
          if (g->history[uVar21] != '\0') {
            *(undefined4 *)(g->out + uVar21 * 4) =
                 *(undefined4 *)(CONCAT44(in_register_0000000c,req_comp) + uVar21 * 4);
          }
          uVar21 = uVar21 + 1;
        } while (uVar7 != uVar21);
      }
    }
    else if ((uVar25 == 2) && (0 < (int)uVar7)) {
      uVar21 = 0;
      do {
        if (g->history[uVar21] != '\0') {
          *(undefined4 *)(g->out + uVar21 * 4) = *(undefined4 *)(g->background + uVar21 * 4);
        }
        uVar21 = uVar21 + 1;
      } while (uVar7 != uVar21);
    }
    memcpy(g->background,g->out,(long)g->h * (long)g->w * 4);
    psVar15 = g->history;
    __size_00 = (long)g->h * (long)g->w;
  }
  memset(psVar15,0,__size_00);
LAB_0011cca1:
  psVar15 = s->img_buffer;
  if (s->img_buffer_end <= psVar15) {
    if (s->read_from_callbacks == 0) {
      pcVar26 = "unknown code";
      goto LAB_0011cfec;
    }
    stbi__refill_buffer(s);
    psVar15 = s->img_buffer;
  }
  psVar14 = psVar15 + 1;
  s->img_buffer = psVar14;
  sVar19 = *psVar15;
  if (sVar19 == '!') {
    if (s->img_buffer_end <= psVar14) {
      if (s->read_from_callbacks == 0) goto LAB_0011ce66;
      stbi__refill_buffer(s);
      psVar14 = s->img_buffer;
    }
    pbVar18 = psVar14 + 1;
    s->img_buffer = pbVar18;
    if (*psVar14 != 0xf9) goto LAB_0011ce66;
    if (pbVar18 < s->img_buffer_end) {
LAB_0011cd39:
      pbVar16 = pbVar18 + 1;
      s->img_buffer = pbVar16;
      bVar6 = *pbVar18;
      if (bVar6 == 4) {
        if (pbVar16 < s->img_buffer_end) {
LAB_0011cd71:
          s->img_buffer = pbVar16 + 1;
          uVar25 = (uint)*pbVar16;
        }
        else {
          if (s->read_from_callbacks != 0) {
            stbi__refill_buffer(s);
            pbVar16 = s->img_buffer;
            goto LAB_0011cd71;
          }
          uVar25 = 0;
        }
        g->eflags = uVar25;
        iVar8 = stbi__get16le(s);
        g->delay = iVar8 * 10;
        if (-1 < (long)g->transparent) {
          g->pal[g->transparent][3] = 0xff;
        }
        if ((g->eflags & 1) != 0) {
          pbVar18 = s->img_buffer;
          if (pbVar18 < s->img_buffer_end) {
LAB_0011ce0e:
            s->img_buffer = pbVar18 + 1;
            bVar6 = *pbVar18;
          }
          else {
            if (s->read_from_callbacks != 0) {
              stbi__refill_buffer(s);
              pbVar18 = s->img_buffer;
              goto LAB_0011ce0e;
            }
            bVar6 = 0;
          }
          g->transparent = (uint)bVar6;
          g->pal[bVar6][3] = '\0';
          goto LAB_0011ce66;
        }
        if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
          psVar15 = s->img_buffer;
LAB_0011ce4a:
          s->img_buffer = psVar15 + 1;
        }
        else {
          psVar15 = s->img_buffer;
          iVar8 = (int)s->img_buffer_end - (int)psVar15;
          if (0 < iVar8) goto LAB_0011ce4a;
          s->img_buffer = s->img_buffer_end;
          (*(s->io).skip)(s->io_user_data,1 - iVar8);
        }
        g->transparent = -1;
LAB_0011ce66:
        do {
          pbVar18 = s->img_buffer;
          if (s->img_buffer_end <= pbVar18) {
            if (s->read_from_callbacks == 0) goto LAB_0011cca1;
            stbi__refill_buffer(s);
            pbVar18 = s->img_buffer;
          }
          s->img_buffer = pbVar18 + 1;
          if (*pbVar18 == 0) goto LAB_0011cca1;
          stbi__skip(s,(uint)*pbVar18);
        } while( true );
      }
    }
    else {
      if (s->read_from_callbacks != 0) {
        stbi__refill_buffer(s);
        pbVar18 = s->img_buffer;
        goto LAB_0011cd39;
      }
      bVar6 = 0;
    }
    stbi__skip(s,(uint)bVar6);
    goto LAB_0011cca1;
  }
  if (sVar19 == ';') {
    return (stbi_uc *)s;
  }
  pcVar26 = "unknown code";
  if (sVar19 != ',') goto LAB_0011cfec;
  iVar8 = stbi__get16le(s);
  iVar9 = stbi__get16le(s);
  iVar10 = stbi__get16le(s);
  iVar11 = stbi__get16le(s);
  pcVar26 = "bad Image Descriptor";
  if ((g->w < iVar10 + iVar8) || (g->h < iVar11 + iVar9)) goto LAB_0011cfec;
  iVar22 = g->w * 4;
  g->line_size = iVar22;
  g->start_x = iVar8 << 2;
  g->start_y = iVar9 * iVar22;
  g->max_x = (iVar10 + iVar8) * 4;
  iVar11 = (iVar11 + iVar9) * iVar22;
  g->max_y = iVar11;
  g->cur_x = iVar8 << 2;
  if (iVar10 != 0) {
    iVar11 = iVar9 * iVar22;
  }
  g->cur_y = iVar11;
  pbVar18 = s->img_buffer;
  pbVar16 = pbVar18;
  if (pbVar18 < s->img_buffer_end) {
LAB_0011cf88:
    pbVar18 = pbVar16 + 1;
    s->img_buffer = pbVar18;
    bVar6 = *pbVar16;
    iVar8 = iVar22 * 8;
    if ((bVar6 & 0x40) == 0) {
      iVar8 = iVar22;
    }
    iVar22 = iVar8;
    g->lflags = (uint)bVar6;
    uVar25 = (int)((uint)bVar6 << 0x19) >> 0x1f & 3;
  }
  else {
    if (s->read_from_callbacks != 0) {
      stbi__refill_buffer(s);
      pbVar16 = s->img_buffer;
      iVar22 = g->line_size;
      goto LAB_0011cf88;
    }
    g->lflags = 0;
    uVar25 = 0;
    bVar6 = 0;
  }
  g->step = iVar22;
  g->parse = uVar25;
  if (bVar6 < 0x80) {
    if ((g->flags & 0x80) == 0) {
      pcVar26 = "missing color table";
LAB_0011cfec:
      *(char **)(in_FS_OFFSET + -0x20) = pcVar26;
      return (stbi_uc *)0x0;
    }
    g->color_table = g->pal[0];
  }
  else {
    iVar8 = -1;
    if ((g->eflags & 1) != 0) {
      iVar8 = g->transparent;
    }
    stbi__gif_parse_colortable(s,g->lpal,2 << (bVar6 & 7),iVar8);
    g->color_table = g->lpal[0];
    pbVar18 = s->img_buffer;
  }
  if (s->img_buffer_end <= pbVar18) {
    if (s->read_from_callbacks == 0) {
      bVar6 = 0;
      goto LAB_0011d097;
    }
    stbi__refill_buffer(s);
    pbVar18 = s->img_buffer;
  }
  s->img_buffer = pbVar18 + 1;
  bVar6 = *pbVar18;
  if (0xc < bVar6) {
    return (stbi_uc *)0x0;
  }
LAB_0011d097:
  uVar25 = 1 << (bVar6 & 0x1f);
  uVar21 = 0;
  do {
    g->codes[uVar21].prefix = -1;
    g->codes[uVar21].first = (stbi_uc)uVar21;
    g->codes[uVar21].suffix = (stbi_uc)uVar21;
    uVar21 = uVar21 + 1;
  } while (uVar25 != uVar21);
  uVar12 = (2 << (bVar6 & 0x1f)) - 1;
  n = 0;
  uVar7 = 0;
  iVar8 = 0;
  bVar3 = false;
  uVar24 = uVar25 + 2;
  uVar4 = 0xffffffff;
  iVar9 = bVar6 + 1;
  uVar5 = uVar12;
LAB_0011d116:
  do {
    for (; uVar13 = uVar5, iVar10 = iVar9, uVar23 = uVar4, uVar20 = uVar24, bVar2 = bVar3,
        iVar9 = iVar8 - iVar10, iVar8 < iVar10; iVar8 = iVar8 + 8) {
      pbVar18 = s->img_buffer;
      pbVar16 = s->img_buffer_end;
      pbVar17 = pbVar18;
      if (n == 0) {
        if (pbVar16 <= pbVar18) {
          if (s->read_from_callbacks == 0) goto LAB_0011d31e;
          stbi__refill_buffer(s);
          pbVar18 = s->img_buffer;
        }
        pbVar17 = pbVar18 + 1;
        s->img_buffer = pbVar17;
        n = (uint)*pbVar18;
        if (*pbVar18 == 0) goto LAB_0011d31e;
        pbVar16 = s->img_buffer_end;
      }
      if (pbVar17 < pbVar16) {
LAB_0011d195:
        s->img_buffer = pbVar17 + 1;
        uVar24 = (uint)*pbVar17;
      }
      else {
        if (s->read_from_callbacks != 0) {
          stbi__refill_buffer(s);
          pbVar17 = s->img_buffer;
          goto LAB_0011d195;
        }
        uVar24 = 0;
      }
      n = n - 1;
      uVar7 = uVar7 | uVar24 << ((byte)iVar8 & 0x1f);
      bVar3 = bVar2;
      uVar24 = uVar20;
      uVar4 = uVar23;
      iVar9 = iVar10;
      uVar5 = uVar13;
    }
    uVar24 = (int)uVar7 >> ((byte)iVar10 & 0x1f);
    uVar27 = uVar7 & uVar13;
    uVar7 = uVar24;
    iVar8 = iVar9;
    bVar3 = true;
    uVar24 = uVar25 + 2;
    uVar4 = 0xffffffff;
    iVar9 = bVar6 + 1;
    uVar5 = uVar12;
  } while (uVar27 == uVar25);
  if (uVar27 == uVar25 + 1) goto LAB_0011d2dd;
  pcVar26 = "no clear code";
  if ((int)uVar20 < (int)uVar27) {
    pcVar26 = "illegal code in raster";
    goto LAB_0011cfec;
  }
  if (!bVar2) goto LAB_0011cfec;
  if ((int)uVar23 < 0) {
    if (uVar27 == uVar20) goto LAB_0011d398;
  }
  else {
    if (0x1fff < (int)uVar20) {
      pcVar26 = "too many codes";
      goto LAB_0011cfec;
    }
    g->codes[(int)uVar20].prefix = (stbi__int16)uVar23;
    sVar19 = g->codes[uVar23].first;
    g->codes[(int)uVar20].first = sVar19;
    if (uVar27 != uVar20 + 1) {
      sVar19 = g->codes[(int)uVar27].first;
    }
    g->codes[(int)uVar20].suffix = sVar19;
    uVar20 = uVar20 + 1;
  }
  stbi__out_gif_code(g,(stbi__uint16)uVar27);
  bVar3 = true;
  uVar24 = uVar20;
  uVar4 = uVar27;
  iVar9 = iVar10 + 1;
  uVar5 = ~(-1 << ((byte)(iVar10 + 1) & 0x1f));
  if (0xfff < (int)uVar20 || (uVar20 & uVar13) != 0) {
    iVar9 = iVar10;
    uVar5 = uVar13;
  }
  goto LAB_0011d116;
LAB_0011d398:
  pcVar26 = "illegal code in raster";
  goto LAB_0011cfec;
LAB_0011d2dd:
  do {
    stbi__skip(s,n);
    pbVar18 = s->img_buffer;
    if (s->img_buffer_end <= pbVar18) {
      if (s->read_from_callbacks == 0) break;
      stbi__refill_buffer(s);
      pbVar18 = s->img_buffer;
    }
    s->img_buffer = pbVar18 + 1;
    n = (uint)*pbVar18;
  } while (*pbVar18 != 0);
LAB_0011d31e:
  psVar15 = g->out;
  if (psVar15 == (stbi_uc *)0x0) {
    return (stbi_uc *)0x0;
  }
  if (psVar1 == (stbi_uc *)0x0) {
    uVar25 = g->h * g->w;
    if (0 < (int)uVar25 && 0 < g->bgindex) {
      uVar21 = 0;
      do {
        if (g->history[uVar21] == '\0') {
          g->pal[g->bgindex][3] = 0xff;
          *(stbi_uc (*) [4])(g->out + uVar21 * 4) = g->pal[g->bgindex];
        }
        uVar21 = uVar21 + 1;
      } while (uVar25 != uVar21);
      return psVar15;
    }
    return psVar15;
  }
  return psVar15;
}

Assistant:

static stbi_uc *stbi__gif_load_next(stbi__context *s, stbi__gif *g, int *comp, int req_comp, stbi_uc *two_back)
{
   int dispose;
   int first_frame;
   int pi;
   int pcount;
   STBI_NOTUSED(req_comp);

   // on first frame, any non-written pixels get the background colour (non-transparent)
   first_frame = 0;
   if (g->out == 0) {
      if (!stbi__gif_header(s, g, comp,0)) return 0; // stbi__g_failure_reason set by stbi__gif_header
      if (!stbi__mad3sizes_valid(4, g->w, g->h, 0))
         return stbi__errpuc("too large", "GIF image is too large");
      pcount = g->w * g->h;
      g->out = (stbi_uc *) stbi__malloc(4 * pcount);
      g->background = (stbi_uc *) stbi__malloc(4 * pcount);
      g->history = (stbi_uc *) stbi__malloc(pcount);
      if (!g->out || !g->background || !g->history)
         return stbi__errpuc("outofmem", "Out of memory");

      // image is treated as "transparent" at the start - ie, nothing overwrites the current background;
      // background colour is only used for pixels that are not rendered first frame, after that "background"
      // color refers to the color that was there the previous frame.
      memset(g->out, 0x00, 4 * pcount);
      memset(g->background, 0x00, 4 * pcount); // state of the background (starts transparent)
      memset(g->history, 0x00, pcount);        // pixels that were affected previous frame
      first_frame = 1;
   } else {
      // second frame - how do we dispose of the previous one?
      dispose = (g->eflags & 0x1C) >> 2;
      pcount = g->w * g->h;

      if ((dispose == 3) && (two_back == 0)) {
         dispose = 2; // if I don't have an image to revert back to, default to the old background
      }

      if (dispose == 3) { // use previous graphic
         for (pi = 0; pi < pcount; ++pi) {
            if (g->history[pi]) {
               memcpy( &g->out[pi * 4], &two_back[pi * 4], 4 );
            }
         }
      } else if (dispose == 2) {
         // restore what was changed last frame to background before that frame;
         for (pi = 0; pi < pcount; ++pi) {
            if (g->history[pi]) {
               memcpy( &g->out[pi * 4], &g->background[pi * 4], 4 );
            }
         }
      } else {
         // This is a non-disposal case eithe way, so just
         // leave the pixels as is, and they will become the new background
         // 1: do not dispose
         // 0:  not specified.
      }

      // background is what out is after the undoing of the previou frame;
      memcpy( g->background, g->out, 4 * g->w * g->h );
   }

   // clear my history;
   memset( g->history, 0x00, g->w * g->h );        // pixels that were affected previous frame

   for (;;) {
      int tag = stbi__get8(s);
      switch (tag) {
         case 0x2C: /* Image Descriptor */
         {
            stbi__int32 x, y, w, h;
            stbi_uc *o;

            x = stbi__get16le(s);
            y = stbi__get16le(s);
            w = stbi__get16le(s);
            h = stbi__get16le(s);
            if (((x + w) > (g->w)) || ((y + h) > (g->h)))
               return stbi__errpuc("bad Image Descriptor", "Corrupt GIF");

            g->line_size = g->w * 4;
            g->start_x = x * 4;
            g->start_y = y * g->line_size;
            g->max_x   = g->start_x + w * 4;
            g->max_y   = g->start_y + h * g->line_size;
            g->cur_x   = g->start_x;
            g->cur_y   = g->start_y;

            // if the width of the specified rectangle is 0, that means
            // we may not see *any* pixels or the image is malformed;
            // to make sure this is caught, move the current y down to
            // max_y (which is what out_gif_code checks).
            if (w == 0)
               g->cur_y = g->max_y;

            g->lflags = stbi__get8(s);

            if (g->lflags & 0x40) {
               g->step = 8 * g->line_size; // first interlaced spacing
               g->parse = 3;
            } else {
               g->step = g->line_size;
               g->parse = 0;
            }

            if (g->lflags & 0x80) {
               stbi__gif_parse_colortable(s,g->lpal, 2 << (g->lflags & 7), g->eflags & 0x01 ? g->transparent : -1);
               g->color_table = (stbi_uc *) g->lpal;
            } else if (g->flags & 0x80) {
               g->color_table = (stbi_uc *) g->pal;
            } else
               return stbi__errpuc("missing color table", "Corrupt GIF");

            o = stbi__process_gif_raster(s, g);
            if (!o) return NULL;

            // if this was the first frame,
            pcount = g->w * g->h;
            if (first_frame && (g->bgindex > 0)) {
               // if first frame, any pixel not drawn to gets the background color
               for (pi = 0; pi < pcount; ++pi) {
                  if (g->history[pi] == 0) {
                     g->pal[g->bgindex][3] = 255; // just in case it was made transparent, undo that; It will be reset next frame if need be;
                     memcpy( &g->out[pi * 4], &g->pal[g->bgindex], 4 );
                  }
               }
            }

            return o;
         }

         case 0x21: // Comment Extension.
         {
            int len;
            int ext = stbi__get8(s);
            if (ext == 0xF9) { // Graphic Control Extension.
               len = stbi__get8(s);
               if (len == 4) {
                  g->eflags = stbi__get8(s);
                  g->delay = 10 * stbi__get16le(s); // delay - 1/100th of a second, saving as 1/1000ths.

                  // unset old transparent
                  if (g->transparent >= 0) {
                     g->pal[g->transparent][3] = 255;
                  }
                  if (g->eflags & 0x01) {
                     g->transparent = stbi__get8(s);
                     if (g->transparent >= 0) {
                        g->pal[g->transparent][3] = 0;
                     }
                  } else {
                     // don't need transparent
                     stbi__skip(s, 1);
                     g->transparent = -1;
                  }
               } else {
                  stbi__skip(s, len);
                  break;
               }
            }
            while ((len = stbi__get8(s)) != 0) {
               stbi__skip(s, len);
            }
            break;
         }

         case 0x3B: // gif stream termination code
            return (stbi_uc *) s; // using '1' causes warning on some compilers

         default:
            return stbi__errpuc("unknown code", "Corrupt GIF");
      }
   }
}